

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_read.cpp
# Opt level: O1

ssize_t __thiscall UniValue::read(UniValue *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  UniValue *pUVar2;
  bool bVar3;
  UniValue **ppUVar4;
  iterator iVar5;
  bool bVar6;
  VType VVar7;
  jtokentype jVar8;
  char *end;
  ulong uVar9;
  undefined4 in_register_00000034;
  VType VVar10;
  char *raw;
  byte bVar11;
  byte bVar12;
  vector<UniValue_*,_std::allocator<UniValue_*>_> stack;
  uint consumed;
  UniValue tmpVal;
  string tokenVal;
  UniValue *newTop;
  UniValue **local_118;
  iterator iStack_110;
  UniValue **local_108;
  UniValue *local_100;
  uint local_f4;
  char *local_f0;
  vector<UniValue,_std::allocator<UniValue>_> *local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e0;
  string *local_d8;
  UniValue local_d0;
  string local_78;
  string local_58;
  ulong local_38;
  
  raw = (char *)CONCAT44(in_register_00000034,__fd);
  clear(this);
  local_108 = (UniValue **)0x0;
  local_118 = (UniValue **)0x0;
  iStack_110._M_current = (UniValue **)0x0;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  end = (char *)((long)__buf + (long)raw);
  local_d8 = (string *)&this->val;
  local_e0 = &this->keys;
  local_e8 = &this->values;
  bVar12 = 0;
  bVar3 = false;
  VVar10 = VNULL;
  local_100 = this;
  do {
    VVar7 = getJsonToken(&local_78,&local_f4,raw,end);
    pUVar2 = local_100;
    if (VVar7 + VOBJ < 2) goto LAB_0050ddd7;
    local_38 = (ulong)local_f4;
    uVar1 = VVar7 - (VNUM|VSTR);
    if ((bVar12 & 8) == 0) {
      if ((bVar12 & 4) == 0) {
        if (bVar3) {
          if ((VVar7 == VARR) || (VVar7 == 0xb)) goto LAB_0050d94b;
        }
        else if ((bVar12 & 2) == 0) {
          if (VVar7 != VBOOL) goto LAB_0050d94b;
        }
        else if (VVar7 == VBOOL) {
          bVar12 = bVar12 & 0xf0;
          bVar3 = false;
          goto LAB_0050d94b;
        }
        goto switchD_0050d968_default;
      }
      if ((uVar1 < 5) || ((VVar7 < VBOOL && ((0x1aU >> (VVar7 & 0x1f) & 1) != 0)))) {
        bVar12 = bVar12 & 0xf3;
      }
      if ((uVar1 < 5) || ((bVar6 = false, VVar7 < VBOOL && ((0x1aU >> (VVar7 & 0x1f) & 1) != 0))))
      goto LAB_0050d94b;
      goto LAB_0050dd9a;
    }
    if ((4 < uVar1) && ((VVar7 | VARR) != VSTR)) goto switchD_0050d968_default;
    bVar12 = bVar12 & 0xf7;
LAB_0050d94b:
    if ((bVar12 & 0x10) != 0) {
      if ((uVar1 < 5) || ((VVar7 | VARR) == VSTR)) goto switchD_0050d968_default;
      bVar12 = bVar12 & 0xef;
    }
    bVar11 = bVar12;
    switch(VVar7) {
    case VOBJ:
    case VSTR:
      VVar10 = VVar7;
      local_f0 = end;
      if (iStack_110._M_current == local_118) {
        if (VVar7 == VOBJ) {
          setObject(local_100);
        }
        else {
          setArray(local_100);
        }
        end = local_f0;
        local_d0._0_8_ = pUVar2;
        if (iStack_110._M_current == local_108) {
          std::vector<UniValue*,std::allocator<UniValue*>>::_M_realloc_insert<UniValue*>
                    ((vector<UniValue*,std::allocator<UniValue*>> *)&local_118,iStack_110,
                     (UniValue **)&local_d0);
        }
        else {
          *iStack_110._M_current = pUVar2;
          iStack_110._M_current = iStack_110._M_current + 1;
        }
      }
      else {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
        UniValue(&local_d0,(VVar7 != VOBJ) + VOBJ,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        pUVar2 = iStack_110._M_current[-1];
        std::vector<UniValue,_std::allocator<UniValue>_>::push_back(&pUVar2->values,&local_d0);
        local_58._M_dataplus._M_p =
             (pointer)((pUVar2->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                       _M_impl.super__Vector_impl_data._M_finish + -1);
        if (iStack_110._M_current == local_108) {
          std::vector<UniValue*,std::allocator<UniValue*>>::_M_realloc_insert<UniValue*const&>
                    ((vector<UniValue*,std::allocator<UniValue*>> *)&local_118,iStack_110,
                     (UniValue **)&local_58);
        }
        else {
          *iStack_110._M_current = (UniValue *)local_58._M_dataplus._M_p;
          iStack_110._M_current = iStack_110._M_current + 1;
        }
        end = local_f0;
        ~UniValue(&local_d0);
      }
      goto LAB_0050dd45;
    case VARR:
    case VNUM:
      bVar6 = false;
      if ((VVar10 == (VNUM|VARR)) || (iStack_110._M_current == local_118)) goto LAB_0050dd9a;
      if ((VVar7 != VARR) + VOBJ != iStack_110._M_current[-1]->typ) goto switchD_0050d968_default;
      iStack_110._M_current = iStack_110._M_current + -1;
      bVar11 = bVar12 & 0xee | 0x10;
      bVar3 = false;
      break;
    case VBOOL:
      if (iStack_110._M_current != local_118) {
        bVar11 = bVar12 | 8;
        if (iStack_110._M_current[-1]->typ == VOBJ) break;
      }
    default:
switchD_0050d968_default:
      bVar6 = false;
      goto LAB_0050dd9a;
    case VNUM|VARR:
      if (iStack_110._M_current == local_118) goto switchD_0050d968_default;
      bVar6 = false;
      if ((VVar10 == VSTR) || (VVar10 == (VNUM|VARR))) goto LAB_0050dd9a;
      VVar10 = iStack_110._M_current[-1]->typ;
LAB_0050dd45:
      bVar11 = bVar12 | (VVar10 != VOBJ) * '\x03' + 1U;
      bVar3 = (bool)(bVar3 | VVar10 == VOBJ);
      break;
    case VNUM|VSTR:
    case 8:
    case 9:
      local_d0.val._M_dataplus._M_p = (pointer)&local_d0.val.field_2;
      local_d0.val._M_string_length = 0;
      local_d0.val.field_2._M_local_buf[0] = '\0';
      local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
      local_d0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d0.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d0.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d0.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (VVar7 == 9) {
        bVar6 = false;
LAB_0050db37:
        setBool(&local_d0,bVar6);
      }
      else if (VVar7 == 8) {
        bVar6 = true;
        goto LAB_0050db37;
      }
      if (iStack_110._M_current == local_118) {
        pUVar2->typ = local_d0.typ;
        std::__cxx11::string::_M_assign(local_d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(local_e0,&local_d0.keys);
        std::vector<UniValue,_std::allocator<UniValue>_>::operator=(local_e8,&local_d0.values);
      }
      else {
        std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                  (&iStack_110._M_current[-1]->values,&local_d0);
LAB_0050db61:
        bVar11 = bVar12 | 0x10;
      }
      goto LAB_0050dd1e;
    case 10:
      UniValue(&local_d0,VNUM,&local_78);
      if (iStack_110._M_current != local_118) {
        std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                  (&iStack_110._M_current[-1]->values,&local_d0);
        goto LAB_0050db61;
      }
      local_100->typ = local_d0.typ;
      std::__cxx11::string::_M_assign(local_d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(local_e0,&local_d0.keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::operator=(local_e8,&local_d0.values);
LAB_0050dd1e:
      ~UniValue(&local_d0);
      break;
    case 0xb:
      if (bVar3) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&iStack_110._M_current[-1]->keys,&local_78);
        bVar12 = bVar12 & 0xfc | 2;
        bVar3 = false;
      }
      else {
        UniValue(&local_d0,VSTR,&local_78);
        iVar5._M_current = iStack_110._M_current;
        ppUVar4 = local_118;
        if (iStack_110._M_current == local_118) {
          local_100->typ = local_d0.typ;
          std::__cxx11::string::_M_assign(local_d8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(local_e0,&local_d0.keys);
          std::vector<UniValue,_std::allocator<UniValue>_>::operator=(local_e8,&local_d0.values);
        }
        else {
          std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                    (&iStack_110._M_current[-1]->values,&local_d0);
        }
        ~UniValue(&local_d0);
        if (iVar5._M_current == ppUVar4) break;
      }
      bVar11 = bVar12 | 0x10;
    }
    bVar6 = true;
    bVar12 = bVar11;
LAB_0050dd9a:
    if (!bVar6) {
LAB_0050ddd7:
      uVar9 = 0;
      goto LAB_0050ddd9;
    }
    raw = raw + local_38;
    VVar10 = VVar7;
    if (local_118 == iStack_110._M_current) {
      jVar8 = getJsonToken(&local_78,&local_f4,raw,end);
      uVar9 = CONCAT71((int7)((ulong)end >> 8),jVar8 == JTOK_NONE);
LAB_0050ddd9:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if (local_118 != (UniValue **)0x0) {
        operator_delete(local_118);
      }
      return uVar9 & 0xffffffff;
    }
  } while( true );
}

Assistant:

bool UniValue::read(const char *raw, size_t size)
{
    clear();

    uint32_t expectMask = 0;
    std::vector<UniValue*> stack;

    std::string tokenVal;
    unsigned int consumed;
    enum jtokentype tok = JTOK_NONE;
    enum jtokentype last_tok = JTOK_NONE;
    const char* end = raw + size;
    do {
        last_tok = tok;

        tok = getJsonToken(tokenVal, consumed, raw, end);
        if (tok == JTOK_NONE || tok == JTOK_ERR)
            return false;
        raw += consumed;

        bool isValueOpen = jsonTokenIsValue(tok) ||
            tok == JTOK_OBJ_OPEN || tok == JTOK_ARR_OPEN;

        if (expect(VALUE)) {
            if (!isValueOpen)
                return false;
            clearExpect(VALUE);

        } else if (expect(ARR_VALUE)) {
            bool isArrValue = isValueOpen || (tok == JTOK_ARR_CLOSE);
            if (!isArrValue)
                return false;

            clearExpect(ARR_VALUE);

        } else if (expect(OBJ_NAME)) {
            bool isObjName = (tok == JTOK_OBJ_CLOSE || tok == JTOK_STRING);
            if (!isObjName)
                return false;

        } else if (expect(COLON)) {
            if (tok != JTOK_COLON)
                return false;
            clearExpect(COLON);

        } else if (!expect(COLON) && (tok == JTOK_COLON)) {
            return false;
        }

        if (expect(NOT_VALUE)) {
            if (isValueOpen)
                return false;
            clearExpect(NOT_VALUE);
        }

        switch (tok) {

        case JTOK_OBJ_OPEN:
        case JTOK_ARR_OPEN: {
            VType utyp = (tok == JTOK_OBJ_OPEN ? VOBJ : VARR);
            if (!stack.size()) {
                if (utyp == VOBJ)
                    setObject();
                else
                    setArray();
                stack.push_back(this);
            } else {
                UniValue tmpVal(utyp);
                UniValue *top = stack.back();
                top->values.push_back(tmpVal);

                UniValue *newTop = &(top->values.back());
                stack.push_back(newTop);
            }

            if (utyp == VOBJ)
                setExpect(OBJ_NAME);
            else
                setExpect(ARR_VALUE);
            break;
            }

        case JTOK_OBJ_CLOSE:
        case JTOK_ARR_CLOSE: {
            if (!stack.size() || (last_tok == JTOK_COMMA))
                return false;

            VType utyp = (tok == JTOK_OBJ_CLOSE ? VOBJ : VARR);
            UniValue *top = stack.back();
            if (utyp != top->getType())
                return false;

            stack.pop_back();
            clearExpect(OBJ_NAME);
            setExpect(NOT_VALUE);
            break;
            }

        case JTOK_COLON: {
            if (!stack.size())
                return false;

            UniValue *top = stack.back();
            if (top->getType() != VOBJ)
                return false;

            setExpect(VALUE);
            break;
            }

        case JTOK_COMMA: {
            if (!stack.size() ||
                (last_tok == JTOK_COMMA) || (last_tok == JTOK_ARR_OPEN))
                return false;

            UniValue *top = stack.back();
            if (top->getType() == VOBJ)
                setExpect(OBJ_NAME);
            else
                setExpect(ARR_VALUE);
            break;
            }

        case JTOK_KW_NULL:
        case JTOK_KW_TRUE:
        case JTOK_KW_FALSE: {
            UniValue tmpVal;
            switch (tok) {
            case JTOK_KW_NULL:
                // do nothing more
                break;
            case JTOK_KW_TRUE:
                tmpVal.setBool(true);
                break;
            case JTOK_KW_FALSE:
                tmpVal.setBool(false);
                break;
            default: /* impossible */ break;
            }

            if (!stack.size()) {
                *this = tmpVal;
                break;
            }

            UniValue *top = stack.back();
            top->values.push_back(tmpVal);

            setExpect(NOT_VALUE);
            break;
            }

        case JTOK_NUMBER: {
            UniValue tmpVal(VNUM, tokenVal);
            if (!stack.size()) {
                *this = tmpVal;
                break;
            }

            UniValue *top = stack.back();
            top->values.push_back(tmpVal);

            setExpect(NOT_VALUE);
            break;
            }

        case JTOK_STRING: {
            if (expect(OBJ_NAME)) {
                UniValue *top = stack.back();
                top->keys.push_back(tokenVal);
                clearExpect(OBJ_NAME);
                setExpect(COLON);
            } else {
                UniValue tmpVal(VSTR, tokenVal);
                if (!stack.size()) {
                    *this = tmpVal;
                    break;
                }
                UniValue *top = stack.back();
                top->values.push_back(tmpVal);
            }

            setExpect(NOT_VALUE);
            break;
            }

        default:
            return false;
        }
    } while (!stack.empty ());

    /* Check that nothing follows the initial construct (parsed above).  */
    tok = getJsonToken(tokenVal, consumed, raw, end);
    if (tok != JTOK_NONE)
        return false;

    return true;
}